

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disp_binder.cpp
# Opt level: O0

disp_binder_unique_ptr_t so_5::create_default_disp_binder(void)

{
  __uniq_ptr_data<so_5::disp_binder_t,_std::default_delete<so_5::disp_binder_t>,_true,_true> in_RDI;
  unique_ptr<so_5::impl::pre5_5_19_default_disp_binder_t,_std::default_delete<so_5::impl::pre5_5_19_default_disp_binder_t>_>
  local_18 [2];
  
  stdcpp::make_unique<so_5::impl::pre5_5_19_default_disp_binder_t>();
  std::unique_ptr<so_5::disp_binder_t,std::default_delete<so_5::disp_binder_t>>::
  unique_ptr<so_5::impl::pre5_5_19_default_disp_binder_t,std::default_delete<so_5::impl::pre5_5_19_default_disp_binder_t>,void>
            ((unique_ptr<so_5::disp_binder_t,std::default_delete<so_5::disp_binder_t>> *)
             in_RDI.
             super___uniq_ptr_impl<so_5::disp_binder_t,_std::default_delete<so_5::disp_binder_t>_>.
             _M_t.
             super__Tuple_impl<0UL,_so_5::disp_binder_t_*,_std::default_delete<so_5::disp_binder_t>_>
             .super__Head_base<0UL,_so_5::disp_binder_t_*,_false>._M_head_impl,local_18);
  std::
  unique_ptr<so_5::impl::pre5_5_19_default_disp_binder_t,_std::default_delete<so_5::impl::pre5_5_19_default_disp_binder_t>_>
  ::~unique_ptr(local_18);
  return (__uniq_ptr_data<so_5::disp_binder_t,_std::default_delete<so_5::disp_binder_t>,_true,_true>
         )(tuple<so_5::disp_binder_t_*,_std::default_delete<so_5::disp_binder_t>_>)
          in_RDI.
          super___uniq_ptr_impl<so_5::disp_binder_t,_std::default_delete<so_5::disp_binder_t>_>._M_t
          .super__Tuple_impl<0UL,_so_5::disp_binder_t_*,_std::default_delete<so_5::disp_binder_t>_>.
          super__Head_base<0UL,_so_5::disp_binder_t_*,_false>._M_head_impl;
}

Assistant:

SO_5_FUNC disp_binder_unique_ptr_t
create_default_disp_binder()
	{
		return stdcpp::make_unique< impl::pre5_5_19_default_disp_binder_t >();
	}